

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadNodeTransformation(ColladaParser *this,Node *pNode,TransformType pType)

{
  uint uVar1;
  size_type sVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Assimp *this_00;
  ulong uVar4;
  ulong uVar5;
  string tagName;
  Transform tf;
  long *local_b8 [2];
  long local_a8 [2];
  value_type local_98;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar3 == '\0') {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,(char *)CONCAT44(extraout_var,iVar3),(allocator<char> *)&local_98)
    ;
    local_98.mID._M_dataplus._M_p = (pointer)&local_98.mID.field_2;
    local_98.mID._M_string_length = 0;
    local_98.mID.field_2._M_local_buf[0] = '\0';
    local_98.mType = pType;
    iVar3 = TestAttribute(this,"sid");
    if (-1 < iVar3) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      sVar2 = local_98.mID._M_string_length;
      strlen((char *)CONCAT44(extraout_var_00,iVar3));
      std::__cxx11::string::_M_replace
                ((ulong)&local_98,0,(char *)sVar2,CONCAT44(extraout_var_00,iVar3));
    }
    this_00 = (Assimp *)GetTextContent(this);
    uVar4 = (ulong)pType;
    uVar1 = ReadNodeTransformation::sNumParameters[uVar4];
    uVar5 = 0;
    do {
      this_00 = (Assimp *)
                fast_atoreal_move<float>
                          (this_00,(char *)(local_98.f + uVar5),(float *)0x1,SUB81(uVar4,0));
      while ((uVar4 = (ulong)(byte)*this_00, uVar4 < 0x21 &&
             ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
        this_00 = this_00 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1 + (uVar1 == 0));
    std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::push_back
              (&pNode->mTransforms,&local_98);
    TestClosing(this,(char *)local_b8[0]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.mID._M_dataplus._M_p != &local_98.mID.field_2) {
      operator_delete(local_98.mID._M_dataplus._M_p,
                      CONCAT71(local_98.mID.field_2._M_allocated_capacity._1_7_,
                               local_98.mID.field_2._M_local_buf[0]) + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadNodeTransformation(Node* pNode, TransformType pType)
{
    if (mReader->isEmptyElement())
        return;

    std::string tagName = mReader->getNodeName();

    Transform tf;
    tf.mType = pType;

    // read SID
    int indexSID = TestAttribute("sid");
    if (indexSID >= 0)
        tf.mID = mReader->getAttributeValue(indexSID);

    // how many parameters to read per transformation type
    static const unsigned int sNumParameters[] = { 9, 4, 3, 3, 7, 16 };
    const char* content = GetTextContent();

    // read as many parameters and store in the transformation
    for (unsigned int a = 0; a < sNumParameters[pType]; a++)
    {
        // read a number
        content = fast_atoreal_move<ai_real>(content, tf.f[a]);
        // skip whitespace after it
        SkipSpacesAndLineEnd(&content);
    }

    // place the transformation at the queue of the node
    pNode->mTransforms.push_back(tf);

    // and consume the closing tag
    TestClosing(tagName.c_str());
}